

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

uint16_t __thiscall icu_63::Normalizer2Impl::getFCD16FromNormData(Normalizer2Impl *this,UChar32 c)

{
  uint8_t uVar1;
  UBool UVar2;
  UChar32 c_00;
  uint16_t *puVar3;
  uint16_t firstUnit;
  uint16_t *mapping;
  uint16_t deltaTrailCC;
  uint16_t norm16;
  UChar32 c_local;
  Normalizer2Impl *this_local;
  
  mapping._2_2_ = getNorm16(this,c);
  if (this->limitNoNo <= mapping._2_2_) {
    if (0xfbff < mapping._2_2_) {
      uVar1 = getCCFromNormalYesOrMaybe(mapping._2_2_);
      return CONCAT11(uVar1,uVar1);
    }
    if (this->minMaybeYes <= mapping._2_2_) {
      return 0;
    }
    if ((mapping._2_2_ & 6) < 3) {
      return (uint16_t)((int)(uint)(mapping._2_2_ & 6) >> 1);
    }
    c_00 = mapAlgorithmic(this,c,mapping._2_2_);
    mapping._2_2_ = getRawNorm16(this,c_00);
  }
  if ((this->minYesNo < mapping._2_2_) && (UVar2 = isHangulLVT(this,mapping._2_2_), UVar2 == '\0'))
  {
    puVar3 = getMapping(this,mapping._2_2_);
    mapping._2_2_ = *puVar3 >> 8;
    if ((*puVar3 & 0x80) != 0) {
      mapping._2_2_ = mapping._2_2_ | puVar3[-1] & 0xff00;
    }
    return mapping._2_2_;
  }
  return 0;
}

Assistant:

uint16_t Normalizer2Impl::getFCD16FromNormData(UChar32 c) const {
    uint16_t norm16=getNorm16(c);
    if (norm16 >= limitNoNo) {
        if(norm16>=MIN_NORMAL_MAYBE_YES) {
            // combining mark
            norm16=getCCFromNormalYesOrMaybe(norm16);
            return norm16|(norm16<<8);
        } else if(norm16>=minMaybeYes) {
            return 0;
        } else {  // isDecompNoAlgorithmic(norm16)
            uint16_t deltaTrailCC = norm16 & DELTA_TCCC_MASK;
            if (deltaTrailCC <= DELTA_TCCC_1) {
                return deltaTrailCC >> OFFSET_SHIFT;
            }
            // Maps to an isCompYesAndZeroCC.
            c=mapAlgorithmic(c, norm16);
            norm16=getRawNorm16(c);
        }
    }
    if(norm16<=minYesNo || isHangulLVT(norm16)) {
        // no decomposition or Hangul syllable, all zeros
        return 0;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    norm16=firstUnit>>8;  // tccc
    if(firstUnit&MAPPING_HAS_CCC_LCCC_WORD) {
        norm16|=*(mapping-1)&0xff00;  // lccc
    }
    return norm16;
}